

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

dicthashelement_t * dictinstall(char *name,dicthashelement_t **hashtable)

{
  uint uVar1;
  dicthashelement_t *pdVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  
  pdVar2 = dictlookup(name,hashtable);
  if (pdVar2 == (dicthashelement_t *)0x0) {
    pdVar2 = (dicthashelement_t *)calloc(1,0x20);
    if (pdVar2 != (dicthashelement_t *)0x0) {
      pcVar3 = strdup(name);
      pdVar2->word = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pdVar2->nphns = 0;
        cVar5 = *name;
        uVar4 = 0;
        if (cVar5 != '\0') {
          pcVar3 = name + 1;
          do {
            uVar1 = (int)uVar4 * 0x25 + (int)cVar5;
            uVar4 = (ulong)uVar1;
            cVar5 = *pcVar3;
            pcVar3 = pcVar3 + 1;
          } while (cVar5 != '\0');
          uVar4 = (ulong)(uVar1 % 0x2717);
        }
        pdVar2->next = hashtable[uVar4];
        hashtable[uVar4] = pdVar2;
        return pdVar2;
      }
    }
    pdVar2 = (dicthashelement_t *)0x0;
  }
  return pdVar2;
}

Assistant:

dicthashelement_t *dictinstall(char *name, dicthashelement_t **hashtable)
{
    dicthashelement_t  *np;
    unsigned hashval;

    if ((np = dictlookup(name, hashtable)) == NULL)
    {
        np = (dicthashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || (np->word = strdup(name)) == NULL)
            return NULL;

        np->nphns = 0;
        hashval = dicthash(name);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}